

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

void __thiscall duckdb::SampleOptions::Serialize(SampleOptions *this,Serializer *serializer)

{
  int64_t local_18;
  
  Serializer::WriteProperty<duckdb::Value>(serializer,100,"sample_size",&this->sample_size);
  Serializer::WritePropertyWithDefault<bool>(serializer,0x65,"is_percentage",&this->is_percentage);
  (*serializer->_vptr_Serializer[2])(serializer,0x66,"method");
  Serializer::WriteValue<duckdb::SampleMethod>(serializer,this->method);
  (*serializer->_vptr_Serializer[3])(serializer);
  local_18 = GetSeed(this);
  Serializer::WritePropertyWithDefault<long>(serializer,0x67,"seed",&local_18);
  return;
}

Assistant:

void SampleOptions::Serialize(Serializer &serializer) const {
	serializer.WriteProperty<Value>(100, "sample_size", sample_size);
	serializer.WritePropertyWithDefault<bool>(101, "is_percentage", is_percentage);
	serializer.WriteProperty<SampleMethod>(102, "method", method);
	serializer.WritePropertyWithDefault<int64_t>(103, "seed", GetSeed());
}